

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  int in_EDI;
  RaspiCam_Cv *in_stack_000000b0;
  char **in_stack_000000b8;
  int in_stack_000000c4;
  double secondsElapsed;
  int i;
  double time_;
  int nCount;
  Mat image;
  RaspiCam_Cv Camera;
  Mat *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  vector *in_stack_fffffffffffffd98;
  char **in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  _InputArray local_1d0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [36];
  int local_154;
  double local_150;
  int local_144;
  Mat local_140 [96];
  string local_e0 [36];
  undefined4 local_bc;
  RaspiCam_Cv local_b8 [135];
  allocator<char> local_31;
  string local_30 [44];
  int local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_4 = 0;
  if (in_EDI == 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Usage (-help for help)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  iVar4 = findParam(in_stack_fffffffffffffdc0,iVar4,in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (iVar4 == -1) {
    raspicam::RaspiCam_Cv::RaspiCam_Cv(local_b8);
    processCommandLine(in_stack_000000c4,in_stack_000000b8,in_stack_000000b0);
    poVar5 = std::operator<<((ostream *)&std::cout,"Connecting to camera");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar3 = raspicam::RaspiCam::open(SUB81(local_b8,0));
    if ((bVar3 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error opening camera");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_4 = -1;
      local_bc = 1;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Connected to camera =");
      raspicam::RaspiCam_Cv::getId_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_e0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_e0);
      cv::Mat::Mat(local_140);
      local_144 = 100;
      poVar5 = std::operator<<((ostream *)&std::cout,"Capturing");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      lVar6 = cv::getTickCount();
      local_150 = (double)lVar6;
      for (local_154 = 0; local_154 < local_144; local_154 = local_154 + 1) {
        raspicam::RaspiCam::grab();
        raspicam::RaspiCam_Cv::retrieve((Mat *)local_b8);
        if ((doTestSpeedOnly & 1U) == 0) {
          if (local_154 % 5 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"\r capturing ...");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_154);
            poVar5 = std::operator<<(poVar5,"/");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_144);
            std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
          }
          if ((local_154 % 0x1e == 0) && (local_154 != 0)) {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
            std::operator+((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
            std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
            cv::_InputArray::_InputArray
                      ((_InputArray *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
            local_1e8 = 0;
            uStack_1e0 = 0;
            local_1d8 = 0;
            in_stack_fffffffffffffd98 = (vector *)&local_1e8;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x104956);
            cv::imwrite(local_178,&local_1d0,in_stack_fffffffffffffd98);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd60);
            cv::_InputArray::~_InputArray(&local_1d0);
            std::__cxx11::string::~string(local_178);
            std::__cxx11::string::~string(local_198);
            std::__cxx11::string::~string(local_1b8);
          }
        }
      }
      if ((doTestSpeedOnly & 1U) == 0) {
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"Images saved in imagexx.jpg");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      lVar6 = cv::getTickCount();
      dVar2 = (double)lVar6 - local_150;
      dVar1 = (double)cv::getTickFrequency();
      dVar2 = dVar2 / dVar1;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar2);
      poVar5 = std::operator<<(poVar5," seconds for ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_144);
      poVar5 = std::operator<<(poVar5,"  frames : FPS = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)((double)local_144 / dVar2));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      raspicam::RaspiCam::release();
      cv::Mat::~Mat(local_140);
      local_bc = 0;
    }
    raspicam::RaspiCam_Cv::~RaspiCam_Cv(local_b8);
  }
  else {
    showUsage();
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main ( int argc,char **argv ) {
    if ( argc==1 ) {
        cerr<<"Usage (-help for help)"<<endl;
    }
    if ( findParam ( "-help",argc,argv ) !=-1 ) {
        showUsage();
        return -1;
    }

    raspicam::RaspiCam_Cv Camera;
    processCommandLine ( argc,argv,Camera );
    cout<<"Connecting to camera"<<endl;
    if ( !Camera.open() ) {
        cerr<<"Error opening camera"<<endl;
        return -1;
    }
    cout<<"Connected to camera ="<<Camera.getId() <<endl;

    cv::Mat image;
    int nCount=100;
    cout<<"Capturing"<<endl;

    double time_=cv::getTickCount();

    for ( int i=0; i<nCount; i++ ) {
        Camera.grab();
        Camera.retrieve ( image );
        if ( !doTestSpeedOnly ) {
            if ( i%5==0 ) 	  cout<<"\r capturing ..."<<i<<"/"<<nCount<<std::flush;
            if ( i%30==0 && i!=0 )
                cv::imwrite ("image"+std::to_string(i)+".jpg",image );
        }
    }
    if ( !doTestSpeedOnly )  cout<<endl<<"Images saved in imagexx.jpg"<<endl;
    double secondsElapsed= double ( cv::getTickCount()-time_ ) /double ( cv::getTickFrequency() ); //time in second
    cout<< secondsElapsed<<" seconds for "<< nCount<<"  frames : FPS = "<< ( float ) ( ( float ) ( nCount ) /secondsElapsed ) <<endl;
    Camera.release();

}